

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O1

uint CalculateNextWorkRequired(CBlockIndex *pindexLast,int64_t nFirstBlockTime,Params *params)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  arith_uint256 bnNew;
  arith_uint256 bnPowLimit;
  base_uint<256U> local_88;
  base_uint<256U> local_68;
  base_uint<256U> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (params->fPowNoRetargeting == true) {
    uVar3 = pindexLast->nBits;
  }
  else {
    lVar4 = (ulong)pindexLast->nTime - nFirstBlockTime;
    lVar1 = params->nPowTargetTimespan;
    lVar5 = lVar1 + 3;
    if (-1 < lVar1) {
      lVar5 = lVar1;
    }
    lVar6 = lVar5 >> 2;
    if (lVar5 >> 2 < lVar4) {
      lVar6 = lVar4;
    }
    lVar5 = lVar1 * 4;
    if (lVar6 < lVar1 * 4) {
      lVar5 = lVar6;
    }
    UintToArith256((arith_uint256 *)&local_40,&params->powLimit);
    local_68.pn[4] = 0;
    local_68.pn[5] = 0;
    local_68.pn[6] = 0;
    local_68.pn[7] = 0;
    local_68.pn[0] = 0;
    local_68.pn[1] = 0;
    local_68.pn[2] = 0;
    local_68.pn[3] = 0;
    if (params->enforce_BIP94 == true) {
      pindexLast = CBlockIndex::GetAncestor
                             (pindexLast,
                              (pindexLast->nHeight -
                              (int)(params->nPowTargetTimespan / params->nPowTargetSpacing)) + 1);
    }
    arith_uint256::SetCompact((arith_uint256 *)&local_68,pindexLast->nBits,(bool *)0x0,(bool *)0x0);
    base_uint<256U>::operator*=(&local_68,(uint32_t)lVar5);
    local_88.pn[0] = (uint32_t)params->nPowTargetTimespan;
    local_88.pn[1] = (uint32_t)((ulong)params->nPowTargetTimespan >> 0x20);
    local_88.pn[2] = 0;
    local_88.pn[3] = 0;
    local_88.pn[4] = 0;
    local_88.pn[5] = 0;
    local_88.pn[6] = 0;
    local_88.pn[7] = 0;
    base_uint<256U>::operator/=(&local_68,&local_88);
    iVar2 = base_uint<256U>::CompareTo(&local_68,&local_40);
    if (0 < iVar2) {
      local_68.pn[4] = local_40.pn[4];
      local_68.pn[5] = local_40.pn[5];
      local_68.pn[6] = local_40.pn[6];
      local_68.pn[7] = local_40.pn[7];
      local_68.pn[0] = local_40.pn[0];
      local_68.pn[1] = local_40.pn[1];
      local_68.pn[2] = local_40.pn[2];
      local_68.pn[3] = local_40.pn[3];
    }
    uVar3 = arith_uint256::GetCompact((arith_uint256 *)&local_68,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CalculateNextWorkRequired(const CBlockIndex* pindexLast, int64_t nFirstBlockTime, const Consensus::Params& params)
{
    if (params.fPowNoRetargeting)
        return pindexLast->nBits;

    // Limit adjustment step
    int64_t nActualTimespan = pindexLast->GetBlockTime() - nFirstBlockTime;
    if (nActualTimespan < params.nPowTargetTimespan/4)
        nActualTimespan = params.nPowTargetTimespan/4;
    if (nActualTimespan > params.nPowTargetTimespan*4)
        nActualTimespan = params.nPowTargetTimespan*4;

    // Retarget
    const arith_uint256 bnPowLimit = UintToArith256(params.powLimit);
    arith_uint256 bnNew;

    // Special difficulty rule for Testnet4
    if (params.enforce_BIP94) {
        // Here we use the first block of the difficulty period. This way
        // the real difficulty is always preserved in the first block as
        // it is not allowed to use the min-difficulty exception.
        int nHeightFirst = pindexLast->nHeight - (params.DifficultyAdjustmentInterval()-1);
        const CBlockIndex* pindexFirst = pindexLast->GetAncestor(nHeightFirst);
        bnNew.SetCompact(pindexFirst->nBits);
    } else {
        bnNew.SetCompact(pindexLast->nBits);
    }

    bnNew *= nActualTimespan;
    bnNew /= params.nPowTargetTimespan;

    if (bnNew > bnPowLimit)
        bnNew = bnPowLimit;

    return bnNew.GetCompact();
}